

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine_options.hpp
# Opt level: O3

bool __thiscall
duckdb::CSVStateMachineOptions::operator==
          (CSVStateMachineOptions *this,CSVStateMachineOptions *other)

{
  bool bVar1;
  
  bVar1 = CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator==(&this->delimiter,&other->delimiter);
  if ((((bVar1) && ((this->quote).value == (other->quote).value)) &&
      ((this->escape).value == (other->escape).value)) &&
     (((this->new_line).value == (other->new_line).value &&
      ((this->comment).value == (other->comment).value)))) {
    bVar1 = (this->strict_mode).value == (other->strict_mode).value;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool operator==(const CSVStateMachineOptions &other) const {
		return delimiter == other.delimiter && quote == other.quote && escape == other.escape &&
		       new_line == other.new_line && comment == other.comment && strict_mode == other.strict_mode;
	}